

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sample_states.cpp
# Opt level: O0

void __thiscall
SMC::sample_distance
          (SMC *this,Atom *b,Atom *c,Atom *B,double theta,double lcd,Atom *p,double lcon,int label,
          int rem)

{
  int iVar1;
  int iVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double local_6d0;
  double threshold;
  double frand_chose;
  Point local_6a8;
  Point local_690;
  Point local_678;
  Point local_660;
  Point local_648;
  Point local_630;
  Point local_618;
  Point local_600;
  Point local_5e8;
  Point local_5d0;
  Point local_5b8;
  Point local_5a0;
  Point local_588;
  Point local_570;
  Point local_558;
  Point local_540;
  double local_528;
  double gamma;
  double dStack_518;
  int i_1;
  double c2;
  double c1;
  double randr;
  int i;
  int floor;
  double pdf [32];
  double cdf [32];
  double denominator;
  int max_intY;
  int min_intY;
  double highgap;
  double lowgap;
  double y;
  double d;
  double x2;
  double x1;
  int conlower;
  double mindeld;
  double delby;
  double distby;
  double x;
  undefined1 local_280 [8];
  Atom p2;
  Atom p1;
  int length;
  double md [2];
  Point local_1c0;
  Point local_1a8;
  undefined1 local_190 [8];
  Point mp;
  Point local_160;
  undefined1 local_148 [8];
  Point mm;
  Point local_118;
  Point local_100;
  Point local_e8;
  Point local_d0;
  undefined1 local_b8 [8];
  Point Bp;
  Point local_88;
  undefined1 local_70 [8];
  Point e;
  double lbc;
  int label_local;
  double lcon_local;
  Atom *p_local;
  double lcd_local;
  double theta_local;
  Atom *B_local;
  Atom *c_local;
  Atom *b_local;
  SMC *this_local;
  
  e.z = Point::dis(&b->super_Point,&c->super_Point);
  Point::operator-((Point *)&Bp.z,&c->super_Point,&b->super_Point);
  dVar3 = cos(theta);
  Point::operator*(&local_88,(Point *)&Bp.z,(lcd * dVar3) / e.z);
  Point::operator-((Point *)local_70,&c->super_Point,&local_88);
  Point::operator-(&local_e8,&c->super_Point,&b->super_Point);
  Point::operator-(&local_100,&B->super_Point,(Point *)local_70);
  Point::operator-(&local_118,&c->super_Point,&b->super_Point);
  dVar3 = Point::dot(&local_100,&local_118);
  Point::operator-((Point *)&mm.z,&c->super_Point,&b->super_Point);
  dVar4 = Point::square((Point *)&mm.z);
  Point::operator*(&local_d0,&local_e8,dVar3 / dVar4);
  Point::operator-((Point *)local_b8,&B->super_Point,&local_d0);
  Point::operator-((Point *)&mp.z,(Point *)local_b8,(Point *)local_70);
  dVar3 = sin(theta);
  dVar4 = Point::dis((Point *)local_b8,(Point *)local_70);
  Point::operator*(&local_160,(Point *)&mp.z,(lcd * dVar3) / dVar4);
  Point::operator+((Point *)local_148,(Point *)local_70,&local_160);
  Point::operator-(&local_1c0,(Point *)local_b8,(Point *)local_70);
  dVar3 = sin(theta);
  dVar4 = Point::dis((Point *)local_b8,(Point *)local_70);
  Point::operator*(&local_1a8,&local_1c0,(lcd * dVar3) / dVar4);
  Point::operator-((Point *)local_190,(Point *)local_70,&local_1a8);
  dVar5 = Point::dis((Point *)local_190,&B->super_Point);
  dVar5 = lcon - dVar5;
  dVar6 = Point::dis((Point *)local_148,&B->super_Point);
  dVar6 = lcon - dVar6;
  Atom::Atom((Atom *)&p2._posn,0.0,0.0,0.0,-0x3039);
  Atom::Atom((Atom *)local_280,0.0,0.0,0.0,-0x3039);
  dVar7 = lcon - this->minDistcon[label][rem];
  dVar3 = this->DistconBy[label][rem];
  dVar4 = this->DistdelBy[label][rem];
  dVar10 = this->minDistdel[label][rem];
  iVar1 = (int)(dVar7 / dVar3 + 1e-05);
  dVar8 = (double)iVar1 * dVar3;
  dVar9 = dVar8 + dVar3;
  denominator._4_4_ = (int)((dVar5 - dVar10) * (1.0 / dVar4));
  iVar2 = (int)((dVar6 - dVar10) * (1.0 / dVar4));
  denominator._0_4_ = iVar2 + 1;
  if (0.0 < dVar5 - dVar10) {
    *(double *)(&i + (long)denominator._4_4_ * 2) =
         (this->etedCon[label][rem][iVar1 + 1][denominator._4_4_ + 1] * (dVar7 - dVar8) *
          (-dVar4 * (double)denominator._4_4_ + (dVar5 - dVar10)) +
         this->etedCon[label][rem][iVar1][denominator._4_4_ + 1] * (dVar9 - dVar7) *
         (-dVar4 * (double)denominator._4_4_ + (dVar5 - dVar10)) +
         this->etedCon[label][rem][iVar1][denominator._4_4_] * (dVar9 - dVar7) *
         (dVar4 * (double)(denominator._4_4_ + 1) + -dVar5 + dVar10) +
         this->etedCon[label][rem][iVar1 + 1][denominator._4_4_] * (dVar7 - dVar8) *
         (dVar4 * (double)(denominator._4_4_ + 1) + -dVar5 + dVar10)) / (dVar3 * dVar4);
    highgap = dVar4 - (-dVar4 * (double)denominator._4_4_ + (dVar5 - dVar10));
  }
  else {
    denominator._4_4_ = 0;
    _i = ((dVar9 - dVar7) * this->etedCon[label][rem][iVar1][0] +
         (dVar7 - dVar8) * this->etedCon[label][rem][iVar1 + 1][0]) * (1.0 / dVar3);
    highgap = 0.0;
  }
  if (denominator._0_4_ < 0x20) {
    *(double *)(&i + (long)denominator._0_4_ * 2) =
         (this->etedCon[label][rem][iVar1 + 1][denominator._0_4_] * (dVar7 - dVar8) *
          (-dVar4 * (double)iVar2 + (dVar6 - dVar10)) +
         this->etedCon[label][rem][iVar1][denominator._0_4_] * (dVar9 - dVar7) *
         (-dVar4 * (double)iVar2 + (dVar6 - dVar10)) +
         this->etedCon[label][rem][iVar1][iVar2] * (dVar9 - dVar7) *
         (dVar4 * (double)denominator._0_4_ + -dVar6 + dVar10) +
         this->etedCon[label][rem][iVar1 + 1][iVar2] * (dVar7 - dVar8) *
         (dVar4 * (double)denominator._0_4_ + -dVar6 + dVar10)) / (dVar3 * dVar4);
    _max_intY = dVar4 - ((dVar4 * (double)denominator._0_4_ + dVar10) - dVar6);
  }
  else {
    denominator._0_4_ = 0x1f;
    pdf[0x1e] = ((dVar9 - dVar7) * this->etedCon[label][rem][iVar1][0x1f] +
                (dVar7 - dVar8) * this->etedCon[label][rem][iVar1 + 1][0x1f]) * (1.0 / dVar3);
    _max_intY = 0.0;
  }
  randr._4_4_ = denominator._4_4_ + 1;
  *(double *)(&i + (long)randr._4_4_ * 2) =
       ((dVar9 - dVar7) * this->etedCon[label][rem][iVar1][randr._4_4_] +
       (dVar7 - dVar8) * this->etedCon[label][rem][iVar1 + 1][randr._4_4_]) * (1.0 / dVar3);
  pdf[(long)denominator._4_4_ + 0x1f] = 0.0;
  pdf[(long)randr._4_4_ + 0x1f] =
       (*(double *)(&i + (long)randr._4_4_ * 2) + *(double *)(&i + (long)denominator._4_4_ * 2)) *
       0.5 * highgap;
  for (randr._0_4_ = denominator._4_4_ + 2; randr._0_4_ < denominator._0_4_;
      randr._0_4_ = randr._0_4_ + 1) {
    *(double *)(&i + (long)randr._0_4_ * 2) =
         ((dVar9 - dVar7) * this->etedCon[label][rem][iVar1][randr._0_4_] +
         (dVar7 - dVar8) * this->etedCon[label][rem][iVar1 + 1][randr._0_4_]) * (1.0 / dVar3);
    pdf[(long)randr._0_4_ + 0x1f] =
         (*(double *)(&i + (long)randr._0_4_ * 2) + *(double *)(&i + (long)(randr._0_4_ + -1) * 2))
         * 0.5 * dVar4 + pdf[(long)(randr._0_4_ + -1) + 0x1f];
  }
  pdf[(long)denominator._0_4_ + 0x1f] =
       (*(double *)(&i + (long)denominator._0_4_ * 2) +
       *(double *)(&i + (long)(denominator._0_4_ + -1) * 2)) * 0.5 * _max_intY +
       pdf[(long)(denominator._0_4_ + -1) + 0x1f];
  iVar1 = rand();
  c1 = (((double)iVar1 + 0.5) / 2147483647.0) * (pdf[(long)denominator._0_4_ + 0x1f] - 0.0) + 0.0;
  dStack_518 = 0.0;
  iVar1 = randr._4_4_;
  if (pdf[(long)randr._4_4_ + 0x1f] < c1) {
    do {
      iVar2 = iVar1;
      gamma._4_4_ = iVar2 + 1;
      if (denominator._0_4_ <= gamma._4_4_) goto LAB_0018aafb;
      iVar1 = gamma._4_4_;
    } while (pdf[(long)gamma._4_4_ + 0x1f] < c1);
    c2 = c1 - pdf[(long)iVar2 + 0x1f];
    dStack_518 = pdf[(long)gamma._4_4_ + 0x1f] - pdf[(long)iVar2 + 0x1f];
    lowgap = ((dVar4 * (double)gamma._4_4_ + dVar10) - dVar4) + (c2 * dVar4) / dStack_518;
LAB_0018aafb:
    if ((c1 <= pdf[(long)denominator._0_4_ + 0x1f]) &&
       (pdf[(long)(denominator._0_4_ + -1) + 0x1f] <= c1)) {
      c2 = c1 - pdf[(long)(denominator._0_4_ + -1) + 0x1f];
      dStack_518 = pdf[(long)denominator._0_4_ + 0x1f] - pdf[(long)(denominator._0_4_ + -1) + 0x1f];
      lowgap = dVar4 * (double)(denominator._0_4_ + -1) + dVar10 + (c2 * _max_intY) / dStack_518;
    }
  }
  else {
    dStack_518 = pdf[(long)randr._4_4_ + 0x1f];
    lowgap = dVar5 + (c1 * highgap) / dStack_518;
    c2 = c1;
  }
  Point::operator-(&local_540,&B->super_Point,(Point *)local_70);
  dVar3 = Point::square(&local_540);
  dVar4 = sin(theta);
  dVar10 = sin(theta);
  dVar5 = Point::dis((Point *)local_b8,(Point *)local_70);
  dVar6 = sin(theta);
  local_528 = acos(((lcd * lcd * dVar4 * dVar10 + dVar3) - (lcon - lowgap) * (lcon - lowgap)) /
                   ((dVar5 + dVar5) * lcd * dVar6));
  Point::operator-(&local_5a0,(Point *)local_b8,(Point *)local_70);
  dVar3 = sin(theta);
  dVar4 = cos(local_528);
  dVar10 = Point::dis((Point *)local_b8,(Point *)local_70);
  Point::operator*(&local_588,&local_5a0,(lcd * dVar3 * dVar4) / dVar10);
  Point::operator+(&local_570,(Point *)local_70,&local_588);
  Point::operator-(&local_5e8,(Point *)local_b8,(Point *)local_70);
  Point::operator-(&local_600,&c->super_Point,&b->super_Point);
  Point::cross(&local_5d0,&local_5e8,&local_600);
  dVar3 = sin(theta);
  dVar4 = sin(local_528);
  dVar10 = Point::dis((Point *)local_b8,(Point *)local_70);
  dVar5 = Point::dis(&c->super_Point,&b->super_Point);
  Point::operator*(&local_5b8,&local_5d0,(lcd * dVar3 * dVar4) / (dVar10 * dVar5));
  Point::operator+(&local_558,&local_570,&local_5b8);
  Atom::operator=((Atom *)&p2._posn,&local_558);
  Point::operator-(&local_660,(Point *)local_b8,(Point *)local_70);
  dVar3 = sin(theta);
  dVar4 = cos(local_528);
  dVar10 = Point::dis((Point *)local_b8,(Point *)local_70);
  Point::operator*(&local_648,&local_660,(lcd * dVar3 * dVar4) / dVar10);
  Point::operator+(&local_630,(Point *)local_70,&local_648);
  Point::operator-(&local_6a8,(Point *)local_b8,(Point *)local_70);
  Point::operator-((Point *)&frand_chose,&c->super_Point,&b->super_Point);
  Point::cross(&local_690,&local_6a8,(Point *)&frand_chose);
  dVar3 = sin(theta);
  dVar4 = sin(local_528);
  dVar10 = Point::dis((Point *)local_b8,(Point *)local_70);
  dVar5 = Point::dis(&c->super_Point,&b->super_Point);
  Point::operator*(&local_678,&local_690,(lcd * dVar3 * dVar4) / (dVar10 * dVar5));
  Point::operator-(&local_618,&local_630,&local_678);
  Atom::operator=((Atom *)local_280,&local_618);
  iVar1 = rand();
  local_6d0 = 0.5;
  if (label == 0) {
    if (rem < 5) {
      local_6d0 = 0.52;
    }
    else if ((rem < 5) || (8 < rem)) {
      local_6d0 = 0.5;
    }
    else {
      local_6d0 = 0.51;
    }
  }
  if (local_6d0 < ((double)iVar1 + 0.5) / 2147483647.0 + 0.0) {
    Atom::operator=(p,(Atom *)local_280);
  }
  else {
    Atom::operator=(p,(Atom *)&p2._posn);
  }
  Atom::~Atom((Atom *)local_280);
  Atom::~Atom((Atom *)&p2._posn);
  return;
}

Assistant:

void SMC::sample_distance(const Atom &b, const Atom &c, const Atom &B,
                          const double theta, const double lcd,
                          Atom &p, const double lcon,
                          const int label, const int rem) {
    // Find minimal, maximal distances of point B to bond angle circle
    double lbc = b.dis(c);
    Point e = c - (c - b) * (lcd * cos(theta) / lbc);
    Point Bp = B - (c - b) * ((B - e).dot(c - b) / (c - b).square());
    Point mm = e + (Bp - e) * (lcd * sin(theta) / Bp.dis(e));
    Point mp = e - (Bp - e) * (lcd * sin(theta) / Bp.dis(e));
    double md[2];
    int length = rem;

    md[0] = lcon - mp.dis(B);
    md[1] = lcon - mm.dis(B);
    Atom p1, p2;

    double x = lcon - minDistcon[label][length];
    double distby = DistconBy[label][length];
    double delby = DistdelBy[label][length];
    double mindeld = minDistdel[label][length];

    int conlower = int(x / distby + 0.00001);
    double x1 = conlower * distby;
    double x2 = x1 + distby;
    double d, y, lowgap, highgap = 0;

    int min_intY = int((md[0] - mindeld) * (1 / delby));    // integer lower bound of delta d
    int max_intY = int((md[1] - mindeld) * (1 / delby)) + 1;    // integer upper bound of delta d


    double denominator = distby * delby;
    double cdf[32];
    double pdf[32];

    if (md[0] - mindeld <= 0) {
        min_intY = 0;
        pdf[min_intY] =
                ((x2 - x) * etedCon[label][length][conlower][0] + (x - x1) * etedCon[label][length][conlower + 1][0]) *
                (1 / distby);
        lowgap = 0;
    }
    else {
        pdf[min_intY] =
                (etedCon[label][length][conlower][min_intY] * (x2 - x) * (delby * (min_intY + 1) - md[0] + mindeld) +
                 etedCon[label][length][conlower + 1][min_intY] * (x - x1) *
                 (delby * (min_intY + 1) - md[0] + mindeld) +
                 etedCon[label][length][conlower][min_intY + 1] * (x2 - x) * (md[0] - mindeld - delby * min_intY) +
                 etedCon[label][length][conlower + 1][min_intY + 1] * (x - x1) * (md[0] - mindeld - delby * min_intY)) /
                denominator;
        lowgap = delby - (md[0] - mindeld - delby * min_intY);
    }

    if (max_intY > 31) {
        max_intY = 31;
        pdf[max_intY] = ((x2 - x) * etedCon[label][length][conlower][31] +
                         (x - x1) * etedCon[label][length][conlower + 1][31]) * (1 / distby);
        highgap = 0;
    }
    else {
        pdf[max_intY] =
                (etedCon[label][length][conlower][max_intY - 1] * (x2 - x) * (delby * max_intY - md[1] + mindeld) +
                 etedCon[label][length][conlower + 1][max_intY - 1] * (x - x1) * (delby * max_intY - md[1] + mindeld) +
                 etedCon[label][length][conlower][max_intY] * (x2 - x) * (md[1] - mindeld - delby * (max_intY - 1)) +
                 etedCon[label][length][conlower + 1][max_intY] * (x - x1) *
                 (md[1] - mindeld - delby * (max_intY - 1))) / denominator;

        highgap = delby - (mindeld + delby * max_intY - md[1]);
    }


    int floor = min_intY + 1;
    pdf[floor] = ((x2 - x) * etedCon[label][length][conlower][floor] +
                  (x - x1) * etedCon[label][length][conlower + 1][floor]) * (1 / distby);
    cdf[min_intY] = 0;

    cdf[floor] = (pdf[floor] + pdf[min_intY]) * 0.5 * lowgap;


    for (int i = floor + 1; i < max_intY; i++) {
        pdf[i] = ((x2 - x) * etedCon[label][length][conlower][i] + (x - x1) * etedCon[label][length][conlower + 1][i]) *
                 (1 / distby);
        cdf[i] = cdf[i - 1] + (pdf[i] + pdf[i - 1]) * 0.5 * delby;
    }

    cdf[max_intY] = cdf[max_intY - 1] + (pdf[max_intY] + pdf[max_intY - 1]) * 0.5 * highgap;


    double randr = frand(0, cdf[max_intY]);

    double c1, c2 = 0;
    if (randr <= cdf[floor]) {
        c1 = randr;
        c2 = cdf[floor];
        y = md[0] + c1 * lowgap / c2;
    }
    else {
        for (int i = floor + 1; i < max_intY; i++) {
            if (randr <= cdf[i]) {
                c1 = randr - cdf[i - 1];
                c2 = cdf[i] - cdf[i - 1];
                y = mindeld + delby * i - delby + c1 * delby / c2;
                break;
            }
        }
        if (randr <= cdf[max_intY] && randr >= cdf[max_intY - 1]) {
            c1 = randr - cdf[max_intY - 1];
            c2 = cdf[max_intY] - cdf[max_intY - 1];
            y = mindeld + delby * (max_intY - 1) + c1 * highgap / c2;
        }
    }
    d = lcon - y;

    // Find points on bond angle circle corresponding to distances
    double gamma = acos(((B - e).square() + lcd * lcd * sin(theta) * sin(theta) - d * d) /
                        (2 * Bp.dis(e) * lcd * sin(theta)));
    p1 = e + (Bp - e) * (lcd * sin(theta) * cos(gamma) / Bp.dis(e)) +
         ((Bp - e).cross(c - b)) *
         (lcd * sin(theta) * sin(gamma) / (Bp.dis(e) * c.dis(b)));
    p2 = e + (Bp - e) * (lcd * sin(theta) * cos(gamma) / Bp.dis(e)) -
         ((Bp - e).cross(c - b)) *
         (lcd * sin(theta) * sin(gamma) / (Bp.dis(e) * c.dis(b)));

    double frand_chose = frand(0, 1);
    double threshold = 0.5;
    if (label == 0) {
        if (rem <= 4)
            threshold = 0.52;
        else if (rem > 4 && rem <= 8)
            threshold = 0.51;
        else
            threshold = 0.5;
    }
    if (frand_chose <= threshold)
        p = p1;
    else
        p = p2;
}